

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  iterator __dest;
  allocator<unsigned_int> *paVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  bool bVar2;
  clock_t cVar3;
  ostream *poVar4;
  clock_t cVar5;
  void *this;
  BigNumber local_830;
  BigNumber local_810;
  BigNumber local_7f0;
  undefined1 local_7d0 [8];
  BigNumber resultat;
  undefined1 local_7a8 [4];
  int r;
  BigNumber local_788;
  undefined1 local_768 [8];
  BigNumber n;
  undefined1 local_730 [8];
  BigNumber real_r2;
  uint local_708 [30];
  iterator local_690;
  size_type local_688;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_680;
  undefined1 local_668 [8];
  BigNumber m;
  undefined1 local_630 [8];
  BigNumber v;
  undefined1 local_5f8 [8];
  BigNumber decrypt;
  undefined1 local_5c0 [8];
  BigNumber q;
  undefined1 local_588 [8];
  BigNumber p;
  undefined1 local_550 [8];
  BigNumber encrypt;
  uint local_528 [32];
  iterator local_4a8;
  size_type local_4a0;
  undefined1 local_498 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inv_r;
  uint local_478 [32];
  iterator local_3f8;
  size_type local_3f0;
  undefined1 local_3e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> real_r21;
  uint local_3c8 [32];
  iterator local_348;
  size_type local_340;
  undefined1 local_338 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> d1;
  undefined1 local_288 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> v1;
  uint local_268 [36];
  iterator local_1d8;
  size_type local_1d0;
  undefined1 local_1c8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> n1;
  uint local_1a8 [20];
  iterator local_158;
  size_type local_150;
  undefined1 local_148 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> e1;
  uint local_128 [20];
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> q1;
  allocator<unsigned_int> local_99;
  uint local_98 [18];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> p1;
  unsigned_long base;
  clock_t t2;
  clock_t t1;
  
  p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x100000000;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[0] = 1;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0x10] = 0x4b;
  local_50 = local_98;
  local_48 = 0x11;
  std::allocator<unsigned_int>::allocator(&local_99);
  __l_07._M_len = local_48;
  __l_07._M_array = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,__l_07,&local_99);
  std::allocator<unsigned_int>::~allocator(&local_99);
  local_128[0xc] = 0;
  local_128[0xd] = 0;
  local_128[0xe] = 0;
  local_128[0xf] = 0;
  local_128[8] = 0;
  local_128[9] = 0;
  local_128[10] = 0;
  local_128[0xb] = 0;
  local_128[4] = 0;
  local_128[5] = 0;
  local_128[6] = 0;
  local_128[7] = 0;
  local_128[0] = 1;
  local_128[1] = 0;
  local_128[2] = 0;
  local_128[3] = 0;
  local_128[0x10] = 0x91;
  local_d8 = local_128;
  local_d0 = 0x11;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&e1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_06._M_len = local_d0;
  __l_06._M_array = local_d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8,__l_06,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&e1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_1a8[0xc] = 0;
  local_1a8[0xd] = 0;
  local_1a8[0xe] = 0;
  local_1a8[0xf] = 0;
  local_1a8[8] = 0;
  local_1a8[9] = 0;
  local_1a8[10] = 0;
  local_1a8[0xb] = 0;
  local_1a8[4] = 0;
  local_1a8[5] = 0;
  local_1a8[6] = 0;
  local_1a8[7] = 0;
  local_1a8[0] = 1;
  local_1a8[1] = 0;
  local_1a8[2] = 0;
  local_1a8[3] = 0;
  local_1a8[0x10] = 0x11d;
  local_158 = local_1a8;
  local_150 = 0x11;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&n1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_05._M_len = local_150;
  __l_05._M_array = local_158;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,__l_05,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&n1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_268[0x1c] = 0;
  local_268[0x1d] = 0;
  local_268[0x1e] = 0;
  local_268[0x1f] = 0;
  local_268[0x18] = 0;
  local_268[0x19] = 0;
  local_268[0x1a] = 0;
  local_268[0x1b] = 0;
  local_268[0x14] = 0;
  local_268[0x15] = 0;
  local_268[0x16] = 0;
  local_268[0x17] = 0;
  local_268[0x10] = 0;
  local_268[0x11] = 0;
  local_268[0x12] = 0;
  local_268[0x13] = 0;
  local_268[0xc] = 0;
  local_268[0xd] = 0;
  local_268[0xe] = 0;
  local_268[0xf] = 0;
  local_268[8] = 0;
  local_268[9] = 0;
  local_268[10] = 0;
  local_268[0xb] = 0;
  local_268[4] = 0;
  local_268[5] = 0;
  local_268[6] = 0;
  local_268[7] = 0;
  local_268[0] = 0;
  local_268[1] = 0;
  local_268[2] = 0;
  local_268[3] = 0;
  local_268[0x20] = 0;
  memcpy(local_268,&DAT_0010a0d0,0x84);
  local_1d0 = 0x21;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&v1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  local_1d8 = local_268;
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_04._M_len = local_1d0;
  __l_04._M_array = local_1d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,__l_04,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&v1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  __dest = (iterator)
           ((long)&d1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 4);
  memcpy(__dest,&DAT_0010a154,0x84);
  paVar1 = (allocator<unsigned_int> *)
           ((long)&d1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_03._M_len = 0x21;
  __l_03._M_array = __dest;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_288,__l_03,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&d1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  local_3c8[0x1c] = 0x8cfd26de;
  local_3c8[0x1d] = 0x1f82b6fd;
  local_3c8[0x1e] = 0x19a698bb;
  local_3c8[0x1f] = 0xff23ced5;
  local_3c8[0x18] = 0x4241b04d;
  local_3c8[0x19] = 0x82f912bb;
  local_3c8[0x1a] = 0x882ffae7;
  local_3c8[0x1b] = 0xeeb8be79;
  local_3c8[0x14] = 0x326eb570;
  local_3c8[0x15] = 0x97db4f30;
  local_3c8[0x16] = 0x85aef5df;
  local_3c8[0x17] = 0x48e40f74;
  local_3c8[0x10] = 0x13675a08;
  local_3c8[0x11] = 0x123df8af;
  local_3c8[0x12] = 0x9b155d98;
  local_3c8[0x13] = 0x991883d;
  local_3c8[0xc] = 0xd7afcdbf;
  local_3c8[0xd] = 0x8ce71fa8;
  local_3c8[0xe] = 0x29a5a204;
  local_3c8[0xf] = 0xd5fba5d8;
  local_3c8[8] = 0xa34f4225;
  local_3c8[9] = 0xd5429c0;
  local_3c8[10] = 0x1112636b;
  local_3c8[0xb] = 0x5823739a;
  local_3c8[4] = 0x7d563a6d;
  local_3c8[5] = 0x201f1d62;
  local_3c8[6] = 0x9e7b7a6b;
  local_3c8[7] = 0x792e448b;
  local_3c8[0] = 0x8d1561ff;
  local_3c8[1] = 0xe1291ada;
  local_3c8[2] = 0xfdaf713a;
  local_3c8[3] = 0xdd7818b6;
  local_348 = local_3c8;
  local_340 = 0x20;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&real_r21.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_02._M_len = local_340;
  __l_02._M_array = local_348;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_338,__l_02,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&real_r21.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_478[0x1c] = 0xffffffff;
  local_478[0x1d] = 0xe7ad2069;
  local_478[0x1e] = 0;
  local_478[0x1f] = 0x2a7b;
  local_478[0x18] = 0xffffffff;
  local_478[0x19] = 0xffffffff;
  local_478[0x1a] = 0xffffffff;
  local_478[0x1b] = 0xffffffff;
  local_478[0x14] = 0xffffffff;
  local_478[0x15] = 0xffffffff;
  local_478[0x16] = 0xffffffff;
  local_478[0x17] = 0xffffffff;
  local_478[0x10] = 0xffffffff;
  local_478[0x11] = 0xffffffff;
  local_478[0x12] = 0xffffffff;
  local_478[0x13] = 0xffffffff;
  local_478[0xc] = 0xffffffff;
  local_478[0xd] = 0xffa689a8;
  local_478[0xe] = 0;
  local_478[0xf] = 0xdb;
  local_478[8] = 0xffffffff;
  local_478[9] = 0xffffffff;
  local_478[10] = 0xffffffff;
  local_478[0xb] = 0xffffffff;
  local_478[4] = 0xffffffff;
  local_478[5] = 0xffffffff;
  local_478[6] = 0xffffffff;
  local_478[7] = 0xffffffff;
  local_478[0] = 0xffffffff;
  local_478[1] = 0xffffffff;
  local_478[2] = 0xffffffff;
  local_478[3] = 0xffffffff;
  local_3f8 = local_478;
  local_3f0 = 0x20;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&inv_r.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_01._M_len = local_3f0;
  __l_01._M_array = local_3f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3e8,__l_01,paVar1);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&inv_r.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_528[0x1c] = 0xf8393abf;
  local_528[0x1d] = 0xf734da10;
  local_528[0x1e] = 0xead125fd;
  local_528[0x1f] = 0x2f882c30;
  local_528[0x18] = 0x75f41b7;
  local_528[0x19] = 0x55a1ffba;
  local_528[0x1a] = 0x5f3bb09a;
  local_528[0x1b] = 0x1c809654;
  local_528[0x14] = 0x283fb5da;
  local_528[0x15] = 0x2f0c7ac1;
  local_528[0x16] = 0x78e3bb70;
  local_528[0x17] = 0xb3d3b6db;
  local_528[0x10] = 0x38fa6f19;
  local_528[0x11] = 0xd4f8f36b;
  local_528[0x12] = 0xdd5195e4;
  local_528[0x13] = 0x21e327b1;
  local_528[0xc] = 0x18bef909;
  local_528[0xd] = 0xb6e92d11;
  local_528[0xe] = 0xd4723a4e;
  local_528[0xf] = 0x659d4aa9;
  local_528[8] = 0x57305fec;
  local_528[9] = 0x170ad5c3;
  local_528[10] = 0x3e4aab8c;
  local_528[0xb] = 0x22d9caf2;
  local_528[4] = 0xcf136681;
  local_528[5] = 0x15b0c25b;
  local_528[6] = 0xd3d8b3dd;
  local_528[7] = 0x9f521396;
  local_528[0] = 0x4d3c8026;
  local_528[1] = 0x21d9fc9c;
  local_528[2] = 0x5725a6ec;
  local_528[3] = 0x1d26d8b9;
  local_4a8 = local_528;
  local_4a0 = 0x20;
  paVar1 = (allocator<unsigned_int> *)((long)&encrypt.m_base + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_00._M_len = local_4a0;
  __l_00._M_array = local_4a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_498,__l_00,paVar1);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&encrypt.m_base + 7));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p.m_base,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
  BigNumber::BigNumber
            ((BigNumber *)local_550,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p.m_base
             ,(unsigned_long)
              p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p.m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&q.m_base,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  BigNumber::BigNumber
            ((BigNumber *)local_588,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&q.m_base
             ,(unsigned_long)
              p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&q.m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decrypt.m_base,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
  BigNumber::BigNumber
            ((BigNumber *)local_5c0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decrypt.m_base,
             (unsigned_long)
             p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&decrypt.m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&v.m_base,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_338);
  BigNumber::BigNumber
            ((BigNumber *)local_5f8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&v.m_base
             ,(unsigned_long)
              p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&v.m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&m.m_base,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_288);
  BigNumber::BigNumber
            ((BigNumber *)local_630,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&m.m_base
             ,(unsigned_long)
              p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&m.m_base);
  local_708[0x1c] = 0x4bc;
  local_708[0x1d] = 0x15209;
  local_708[0x18] = 0x15b0c25b;
  local_708[0x19] = 0xd3d8b3dd;
  local_708[0x1a] = 0x9f521396;
  local_708[0x1b] = 0x57305fec;
  local_708[0x14] = 0x21d9fc9c;
  local_708[0x15] = 0x5725a6ec;
  local_708[0x16] = 0x1d26d8b9;
  local_708[0x17] = 0xcf136681;
  local_708[0x10] = 0x1d26d8b9;
  local_708[0x11] = 0xcf136681;
  local_708[0x12] = 0x15b0c25b;
  local_708[0x13] = 0x4d3c8026;
  local_708[0xc] = 0x15b0c25b;
  local_708[0xd] = 0x4d3c8026;
  local_708[0xe] = 0x21d9fc9c;
  local_708[0xf] = 0x5725a6ec;
  local_708[8] = 0x21d9fc9c;
  local_708[9] = 0x5725a6ec;
  local_708[10] = 0x1d26d8b9;
  local_708[0xb] = 0xcf136681;
  local_708[4] = 0x5725a6ec;
  local_708[5] = 0x1d26d8b9;
  local_708[6] = 0xcf136681;
  local_708[7] = 0x15b0c25b;
  local_708[0] = 1;
  local_708[1] = 2;
  local_708[2] = 3;
  local_708[3] = 4;
  local_690 = local_708;
  local_688 = 0x1e;
  paVar1 = (allocator<unsigned_int> *)((long)&real_r2.m_base + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l._M_len = local_688;
  __l._M_array = local_690;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_680,__l,paVar1);
  BigNumber::BigNumber
            ((BigNumber *)local_668,&local_680,
             (unsigned_long)
             p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_680);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&real_r2.m_base + 7));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n.m_base,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3e8);
  BigNumber::BigNumber
            ((BigNumber *)local_730,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n.m_base
             ,(unsigned_long)
              p1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&n.m_base);
  BigNumber::BigNumber(&local_788,(BigNumber *)local_588);
  BigNumber::BigNumber((BigNumber *)local_7a8,(BigNumber *)local_5c0);
  operator*((BigNumber *)local_768,&local_788,(BigNumber *)local_7a8);
  BigNumber::~BigNumber((BigNumber *)local_7a8);
  BigNumber::~BigNumber(&local_788);
  resultat.m_base._4_4_ = Polynome::m_degre((Polynome *)local_768);
  cVar3 = clock();
  BigNumber::m_square_and_multiply
            ((BigNumber *)local_7d0,(BigNumber *)local_668,(BigNumber *)local_550,
             (BigNumber *)local_768,resultat.m_base._4_4_,(BigNumber *)local_630,
             (BigNumber *)local_730);
  poVar4 = std::operator<<((ostream *)&std::cout,"Cipher : ");
  BigNumber::BigNumber(&local_7f0,(BigNumber *)local_7d0);
  poVar4 = operator<<(poVar4,&local_7f0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  BigNumber::~BigNumber(&local_7f0);
  BigNumber::m_square_and_multiply
            (&local_810,(BigNumber *)local_7d0,(BigNumber *)local_5f8,(BigNumber *)local_768,
             resultat.m_base._4_4_,(BigNumber *)local_630,(BigNumber *)local_730);
  BigNumber::operator=((BigNumber *)local_7d0,&local_810);
  BigNumber::~BigNumber(&local_810);
  poVar4 = std::operator<<((ostream *)&std::cout,"Plaintext : ");
  BigNumber::BigNumber(&local_830,(BigNumber *)local_7d0);
  poVar4 = operator<<(poVar4,&local_830);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  BigNumber::~BigNumber(&local_830);
  cVar5 = clock();
  poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1c8b);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,cVar5 - cVar3);
  poVar4 = std::operator<<(poVar4,anon_var_dwarf_1ca1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Comparaison : ");
  bVar2 = operator==((BigNumber *)local_7d0,(BigNumber *)local_668);
  this = (void *)std::ostream::operator<<(poVar4,(uint)bVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  BigNumber::~BigNumber((BigNumber *)local_7d0);
  BigNumber::~BigNumber((BigNumber *)local_768);
  BigNumber::~BigNumber((BigNumber *)local_730);
  BigNumber::~BigNumber((BigNumber *)local_668);
  BigNumber::~BigNumber((BigNumber *)local_630);
  BigNumber::~BigNumber((BigNumber *)local_5f8);
  BigNumber::~BigNumber((BigNumber *)local_5c0);
  BigNumber::~BigNumber((BigNumber *)local_588);
  BigNumber::~BigNumber((BigNumber *)local_550);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_498);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_338);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_288);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return 0;
}

Assistant:

int main() {
    clock_t t1, t2;
    long unsigned int base = 4294967296;

    vector <unsigned int> p1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 75};
    vector <unsigned int> q1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 145};
    vector <unsigned int> e1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 285};
    vector <unsigned int> n1 = {1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 220, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 10875};
    vector <unsigned int> v1 = {1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076, 386586051, 1045080972, 584698610, 415168777, 3068734737, 3564255822, 1704807014, 3640413780, 3181632784, 4176880379, 343992323, 865312491, 2334487511, 1789470971, 3377127848, 432853715, 2287094768, 3608167468, 693513799, 3021682278, 3335659198, 1487342237, 3697028860, 2115296077};
    vector <unsigned int> d1 = {2366988799, 3777567450, 4256133434, 3715635382, 2102803053, 538910050, 2658892395, 2033075339, 2739880485, 223619520, 286417771, 1478718362, 3618622911, 2363957160, 698720772, 3590039000, 325540360, 306051247, 2601868696, 160532541, 846116208, 2547732272, 2242835935, 1222905716, 1111601229, 2197361339, 2284845799, 4005084793, 2365400798, 528660221, 430348475, 4280536789};
    vector <unsigned int> real_r21 = {4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4289104296, 0, 219, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 4294967295, 3886882921, 0, 10875};
    vector <unsigned int> inv_r = {1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076, 386586051, 1045080972, 584698610, 415168777, 3068734737, 3564255822, 1704807081, 955936537, 3573085035, 3713111524, 568534961, 675263962, 789347009, 2028190576, 3016996571, 123683255, 1436680122, 1597747354, 478189140, 4164500159, 4147436048, 3939575293, 797453360};

    BigNumber encrypt (e1, base, 1);
    BigNumber p (p1, base, 1);
    BigNumber q (q1, base, 1);
    BigNumber decrypt (d1, base, 1);
    BigNumber v (v1, base, 1);
    BigNumber m({1,2,3,4, 1462085356, 489085113, 3474155137, 363905627, 567934108, 1462085356, 489085113, 3474155137, 363905627,1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627,1295810598, 567934108, 1462085356, 489085113, 3474155137, 363905627, 3554194397, 2672956310, 1462788076,1212, 86537}, base, 1);
    BigNumber real_r2 (real_r21, base, 1);
    BigNumber n = p*q;
    int r = (int) n.m_degre();
    t1 = clock();
    BigNumber resultat = m.m_square_and_multiply(encrypt, n, r, v, real_r2);
    cout << "Cipher : " << resultat << endl;
    resultat = resultat.m_square_and_multiply(decrypt, n, r, v, real_r2);
    cout << "Plaintext : " << resultat << endl;
    t2 = clock();
    cout << "Chiffré et déchiffré en " << (t2 - t1) << " unités" << endl;
    cout << "Comparaison : " << (int)(resultat == m) <<endl;


    return 0;
}